

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetServerOrientation(VClient *this,Enum *o_rServerOrientation)

{
  bool bVar1;
  reference_const_type pVVar2;
  undefined1 local_38 [8];
  scoped_lock Lock;
  Enum *o_rServerOrientation_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rServerOrientation;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38,&this->m_FrameMutex);
  bVar1 = boost::optional<ViconCGStream::VApplicationInfo>::operator!
                    (&(this->m_CachedFrame).m_ApplicationInfo);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    *(undefined4 *)Lock._8_8_ = 0;
    this_local._4_4_ = NotSupported;
  }
  else {
    pVVar2 = boost::optional<ViconCGStream::VApplicationInfo>::get
                       (&(this->m_CachedFrame).m_ApplicationInfo);
    if (pVVar2->m_AxisOrientation == EZUp) {
      *(undefined4 *)Lock._8_8_ = 2;
    }
    else if (pVVar2->m_AxisOrientation == EYUp) {
      *(undefined4 *)Lock._8_8_ = 1;
    }
    else {
      *(undefined4 *)Lock._8_8_ = 0;
    }
    this_local._4_4_ = Success;
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetServerOrientation( ServerOrientation::Enum & o_rServerOrientation ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  if( m_CachedFrame.m_ApplicationInfo )
  {
    switch(m_CachedFrame.m_ApplicationInfo.get().m_AxisOrientation )
    {
      case  ViconCGStream::VApplicationInfo::EYUp:
        o_rServerOrientation = ServerOrientation::YUp;
        break;
      case ViconCGStream::VApplicationInfo::EZUp:
        o_rServerOrientation = ServerOrientation::ZUp;
        break;
      default:
        o_rServerOrientation=ServerOrientation::Unknown;
        break;
    }
    return Result::Success;
  }
  else
  {
    o_rServerOrientation=ServerOrientation::Unknown;
    return Result::NotSupported;
  }
  
}